

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sve_helper.c
# Opt level: O2

void sve_ldff1_zd(CPUARMState_conflict *env,void *vd,void *vg,void *vm,target_ulong base,
                 uint32_t desc,uintptr_t ra,zreg_off_fn *off_fn,sve_ld1_tlb_fn *tlb_fn,
                 sve_ld1_nf_fn *nonfault_fn)

{
  byte bVar1;
  _Bool _Var2;
  size_t __n;
  target_ulong tVar3;
  ulong oprsz;
  
  bVar1 = (byte)(desc >> 0x12);
  oprsz = (ulong)((desc & 0x1f) * 8 + 8);
  __n = find_next_active((uint64_t *)vg,0,oprsz,3);
  if ((long)__n < (long)oprsz) {
    tVar3 = (*off_fn)(vm,__n);
    (*tlb_fn)(env,vd,__n,base + (tVar3 << (bVar1 & 3)),desc >> 10 & 0xff,ra);
    if (__n == 0) goto LAB_005d663a;
  }
  memset(vd,0,__n);
LAB_005d663a:
  do {
    while( true ) {
      __n = __n + 8;
      if ((long)oprsz <= (long)__n) {
        return;
      }
      if ((*(byte *)((long)vg + ((long)__n >> 3)) & 1) != 0) break;
      *(undefined8 *)((long)vd + __n) = 0;
    }
    tVar3 = (*off_fn)(vm,__n);
    _Var2 = (*nonfault_fn)(env,vd,__n,(tVar3 << (bVar1 & 3)) + base,desc >> 10 & 0xf);
  } while (_Var2);
  record_fault(env,__n,oprsz);
  return;
}

Assistant:

static inline void sve_ldff1_zd(CPUARMState *env, void *vd, void *vg, void *vm,
                                target_ulong base, uint32_t desc, uintptr_t ra,
                                zreg_off_fn *off_fn, sve_ld1_tlb_fn *tlb_fn,
                                sve_ld1_nf_fn *nonfault_fn)
{
    const TCGMemOpIdx oi = extract32(desc, SIMD_DATA_SHIFT, MEMOPIDX_SHIFT);
    const int mmu_idx = get_mmuidx(oi);
    const int scale = extract32(desc, SIMD_DATA_SHIFT + MEMOPIDX_SHIFT, 2);
    intptr_t reg_off, reg_max = simd_oprsz(desc);
    target_ulong addr;

    /* Skip to the first true predicate.  */
    reg_off = find_next_active(vg, 0, reg_max, MO_64);
    if (likely(reg_off < reg_max)) {
        /* Perform one normal read, which will fault or not.  */
        set_helper_retaddr(ra);
        addr = off_fn(vm, reg_off);
        addr = base + (addr << scale);
        tlb_fn(env, vd, reg_off, addr, oi, ra);

        /* The rest of the reads will be non-faulting.  */
        clear_helper_retaddr();
    }

    /* After any fault, zero the leading predicated false elements.  */
    swap_memzero(vd, reg_off);

    while (likely((reg_off += 8) < reg_max)) {
        uint8_t pg = *(uint8_t *)((char *)vg + H1(reg_off >> 3));
        if (likely(pg & 1)) {
            addr = off_fn(vm, reg_off);
            addr = base + (addr << scale);
            if (!nonfault_fn(env, vd, reg_off, addr, mmu_idx)) {
                record_fault(env, reg_off, reg_max);
                break;
            }
        } else {
            *(uint64_t *)((char *)vd + reg_off) = 0;
        }
    }
}